

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,0,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  pair<unsigned_long,_unsigned_long> *ppVar5;
  pointer puVar6;
  unsigned_long *puVar7;
  comm *pcVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  _Elt_pointer ppVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Map_pointer pppVar15;
  unsigned_long uVar16;
  _Map_pointer pppVar17;
  pair<unsigned_long,_unsigned_long> *ppVar18;
  ulong uVar19;
  undefined1 *puVar20;
  pointer puVar21;
  ulong uVar22;
  _Map_pointer pppVar23;
  long lVar24;
  ulong uVar25;
  unsigned_long uVar26;
  unsigned_long uVar27;
  ulong uVar28;
  ulong uVar29;
  comm *pcVar30;
  comm *pcVar31;
  ulong uVar32;
  _Map_pointer pppVar33;
  undefined1 *puVar34;
  _Elt_pointer ppVar35;
  long lVar36;
  _Elt_pointer ppVar37;
  ulong *puVar38;
  bool bVar39;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1d8;
  _Elt_pointer local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_180;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_178;
  _Elt_pointer local_170;
  comm *local_168;
  size_type local_160;
  _Elt_pointer local_158;
  _Elt_pointer ppStack_150;
  _Elt_pointer local_148;
  _Elt_pointer ppStack_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  _Map_pointer local_120;
  pair<unsigned_long,_unsigned_long> local_118;
  size_t local_108;
  ulong local_100;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_180 = right_nsv;
  local_178 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_108 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1d8,0);
  local_160 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_168 = comm;
  local_188 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_160,comm);
  lVar36 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar36 != 0) {
    lVar36 = lVar36 >> 3;
    lVar24 = (long)local_188 - 1;
    ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0013f8db:
    do {
      pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14) {
        uVar25 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar36 + -1];
        ppVar9 = ppVar14;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar10) {
          if (uVar25 < local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar10);
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar10 + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10 + 0x1f;
            ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar10;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_0013f8db;
          }
        }
        else if (uVar25 < local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_0013f8db;
        }
      }
      while( true ) {
        uVar25 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar10 >>
                 4;
        puVar21 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar9 >> 4) +
            uVar25 + ((((ulong)((long)pppVar15 -
                               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar15 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar10) {
          ppVar14 = pppVar15[-1] + 0x20;
        }
        uVar27 = puVar21[lVar36 + -1];
        if (uVar27 != ppVar14[-1].first) break;
        uVar19 = uVar25 - 1;
        if ((long)uVar25 < 1) {
          uVar25 = (long)uVar19 >> 5;
LAB_0013f9dd:
          pppVar23 = pppVar15 + uVar25;
          ppVar12 = *pppVar23;
          ppVar14 = ppVar12 + uVar19 + uVar25 * -0x20;
        }
        else {
          if (0x20 < uVar25) {
            uVar25 = uVar19 >> 5;
            goto LAB_0013f9dd;
          }
          ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar23 = pppVar15;
          ppVar12 = ppVar10;
        }
        if (ppVar14 == ppVar12) {
          ppVar14 = pppVar23[-1] + 0x20;
        }
        if (uVar27 != ppVar14[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar10) {
          operator_delete(ppVar10);
          pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar10 + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10 + 0x1f;
          ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar10;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar15;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar24 + lVar36);
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar21[lVar36 + -1];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_138);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar36 = lVar36 + -1;
      ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (lVar36 != 0);
  }
  local_58.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_138,&local_58,&local_78,(allocator_type *)&local_98);
  pvVar4 = *(void **)local_178;
  *(pointer *)local_178 =
       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_178 + 8) =
       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_178 + 0x10) =
       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = (_Elt_pointer)left_nsv;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar33 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar25 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_188;
  if (uVar25 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_188 = ppVar10, pppVar15 < pppVar33; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar10 = local_188;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar23;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_170;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_148;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar22 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar9) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar22
               ) break;
            operator_delete(ppVar9);
            ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar9 + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9 + 0x1f;
            ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar9;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar22)
            break;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14);
        ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14) {
          do {
            uVar27 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[uVar19];
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar9) {
              if (uVar27 != local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar9);
              ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar9 + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9 + 0x1f;
              ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar9;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar27 != local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14);
        }
      }
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)ppVar10 + uVar19);
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar19];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_138);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar19 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar39 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_188 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_120 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_178,*(undefined8 *)(local_178 + 8));
  pppVar33 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar36 = (long)ppVar10 - (long)local_188;
  local_188 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_100 = (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar36 = (lVar36 >> 4) + ((long)ppVar9 - (long)ppVar14 >> 4) +
           (((uVar19 >> 3) - 1) + (ulong)bVar39) * 0x20;
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_140 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar30 = local_168;
  if (lVar36 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_148 = ppVar10, local_168 = pcVar30, pppVar15 < pppVar33; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar10 = local_148;
    pcVar30 = local_168;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar23;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_188;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_148;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_140;
  if (lVar36 + uVar25 != *(long *)(local_178 + 8) - *(long *)local_178 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_138,&local_100,1,pcVar30);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)pcVar30->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_e0);
  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar30->m_size,(value_type_conflict *)&local_e0,
             (allocator_type *)&local_c8);
  ppVar10 = local_158;
  pcVar8 = local_168;
  iVar2 = pcVar30->m_rank;
  lVar36 = (long)iVar2;
  if (0 < lVar36) {
    uVar19 = *(ulong *)((long)local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar36 * 8 + -8);
    local_188 = *(_Elt_pointer *)local_178;
    local_148 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar27 = 0;
    lVar24 = lVar36;
    do {
      uVar16 = uVar27;
      if (((lVar24 < lVar36) && (uVar27 != 0)) &&
         (uVar16 = uVar27 - 1, uVar19 < local_188[uVar27 - 1].first)) {
        uVar16 = uVar27;
      }
      uVar22 = uVar27 + 1;
      if (uVar27 + 1 < uVar25) {
        uVar22 = uVar25;
      }
      lVar1 = lVar24 + -1;
      uVar32 = *(ulong *)((long)local_138.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      puVar38 = (ulong *)(uVar27 * 0x10 + *(long *)local_178);
      uVar26 = uVar27 - 1;
      do {
        uVar27 = uVar22 - 1;
        if (uVar26 + (1 - uVar22) == -1) break;
        uVar27 = uVar26 + 1;
        uVar29 = *puVar38;
        puVar38 = puVar38 + 2;
        uVar26 = uVar27;
      } while (uVar32 <= uVar29);
      if (uVar32 <= uVar19) {
        *(unsigned_long *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (uVar27 - uVar16) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = uVar16;
        uVar19 = uVar32;
        if (*(ulong *)((long)local_138.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) < local_100)
        break;
      }
      bVar39 = 1 < lVar24;
      lVar24 = lVar1;
    } while (bVar39);
  }
  iVar3 = local_168->m_size;
  if (iVar2 < iVar3 + -1) {
    lVar24 = *(long *)local_178;
    uVar19 = ((unsigned_long *)
             ((long)local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar36];
    lVar36 = lVar36 + 1;
    uVar22 = (*(long *)(local_178 + 8) - lVar24 >> 4) - 1;
    do {
      uVar32 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar36];
      uVar29 = uVar22;
      if (uVar25 < uVar22) {
        puVar38 = (ulong *)(uVar22 * 0x10 + lVar24);
        uVar28 = uVar22;
        do {
          uVar29 = uVar28;
          if (*puVar38 < uVar32) break;
          uVar28 = uVar28 - 1;
          puVar38 = puVar38 + -2;
          uVar29 = uVar25;
        } while (uVar25 < uVar28);
      }
      if (uVar32 <= uVar19) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = (uVar22 - uVar29) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = uVar29;
        uVar19 = uVar32;
        if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] < local_100) break;
      }
      lVar36 = lVar36 + 1;
      uVar22 = uVar29;
    } while (iVar3 != (int)lVar36);
  }
  mxx::all2all<unsigned_long>(&local_e0,&local_98,local_168);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_e0);
  uVar27 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar16 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_f8,(size_type)(uVar27 + uVar16),(allocator_type *)&local_118);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_178,&local_98,&local_b0,
             local_f8.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e0,&local_c8,pcVar8);
  puVar34 = (undefined1 *)
            local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[pcVar8->m_rank];
  local_170 = (_Elt_pointer)(uVar27 + uVar16);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar10,local_160);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_180,local_160);
  pppVar33 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = (_Elt_pointer)puVar34;
  local_148 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_140 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = local_158;
  for (pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node; local_158 = ppVar10,
      pppVar15 < pppVar33; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar10 = local_158;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar23;
  lVar36 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_148;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_140;
  if (lVar36 != 0) {
    uVar25 = lVar36 >> 3;
    do {
      uVar25 = uVar25 - 1;
      puVar21 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar9) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
                puVar21[uVar25]) break;
            (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar10)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar25;
            operator_delete(ppVar9);
            ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar9 + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9 + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar9;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar21[uVar25]) break;
            (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar10)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar25;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
        puVar21 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      local_118.first = puVar21[uVar25];
      local_118.second = uVar25;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_118);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar25;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (uVar25 != 0);
  }
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_188 != (_Elt_pointer)0x0) {
    puVar34 = (undefined1 *)0x0;
    do {
      if (ppVar10 == ppVar9) break;
      puVar20 = (undefined1 *)((long)local_188 + ~(ulong)puVar34);
      ppVar18 = local_f8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)puVar20;
      puVar20 = puVar20 + local_160;
      ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        if (ppVar10 == ppVar14) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
              ppVar18->first) break;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
               (unsigned_long)puVar20;
          operator_delete(ppVar14);
          ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
          ppVar10 = ppVar14 + 0x1f;
          ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar10[-1].first <= ppVar18->first) break;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar10[-1].second] = (unsigned_long)puVar20;
          ppVar10 = ppVar10 + -1;
        }
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
      } while (ppVar10 != ppVar9);
      puVar34 = puVar34 + 1;
    } while ((_Elt_pointer)puVar34 != local_188);
  }
  pppVar33 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_150 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_170;
  if (ppVar10 != ppVar9) {
    puVar21 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar11 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    pppVar17 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar10 == ppVar11) {
        ppVar11 = pppVar17[-1];
        pppVar17 = pppVar17 + -1;
        puVar21[ppVar11[0x1f].second] = local_108;
        ppVar10 = ppVar11 + 0x20;
      }
      else {
        puVar21[ppVar10[-1].second] = local_108;
      }
      ppVar10 = ppVar10 + -1;
      ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar10 != ppVar9);
  }
  for (; local_158 = ppVar12, local_170 = ppVar14, pppVar15 < pppVar33; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar12 = local_158;
    ppVar14 = local_170;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar23;
  puVar21 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_150;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar21) {
    uVar25 = 0;
    do {
      ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar10) {
            ppVar18 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar18[0x1f].first <= puVar21[uVar25]) break;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar18[0x1f].second] = uVar25;
            ppVar12 = ppVar18 + 0x20;
          }
          else {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar21[uVar25]) break;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar25;
            ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar27 = ppVar12[-1].first;
          uVar16 = ppVar12[-1].second;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10)
          goto LAB_00140544;
          while( true ) {
            operator_delete(ppVar10);
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar10 + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10 + 0x1f;
            ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar10;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar9)
              goto LAB_0014057d;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar10) break;
              if (uVar27 != local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00140574;
              (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start
              [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar16;
LAB_00140544:
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar27 != local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar16;
          }
LAB_00140574:
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar9) break;
        } while( true );
      }
LAB_0014057d:
      local_118.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar25];
      local_118.second = uVar25;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_118);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar25;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar25 = uVar25 + 1;
      puVar21 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar25 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar21 >> 3
                             ));
  }
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar14 != local_188) {
    local_168 = (comm *)((long)ppVar14 + -(long)local_188);
    local_170 = (_Elt_pointer)((long)ppVar14 + 0xffffffffffffffff);
    pcVar30 = (comm *)0x0;
    ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar12 = local_188;
LAB_00140618:
    if (ppVar14 != ppVar10) {
      ppVar11 = (_Elt_pointer)((long)ppVar12 + (long)&pcVar30->_vptr_comm);
      local_148 = (_Elt_pointer)((long)ppVar11 * 0x10);
      ppVar18 = local_f8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)ppVar11;
      local_158 = (_Elt_pointer)((long)ppVar11 + local_160);
      ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00140657:
      if (ppVar14 == ppVar12) {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar5[0x1f].first <= ppVar18->first) goto LAB_001407b4;
        (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar5[0x1f].second] = (unsigned_long)local_158;
        uVar27 = ppVar5[0x1f].first;
        uVar16 = ppVar5[0x1f].second;
        operator_delete(ppVar12);
        ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
        ppVar14 = ppVar12 + 0x1f;
        ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar14[-1].first <= ppVar18->first) goto LAB_001407b4;
        (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar14[-1].second] = (unsigned_long)local_158;
        uVar27 = ppVar14[-1].first;
        uVar16 = ppVar14[-1].second;
        ppVar14 = ppVar14 + -1;
      }
      ppVar9 = ppVar14;
      local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
      if (ppVar14 != ppVar10) {
        do {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar12) {
            if (uVar27 != local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_001407a3;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar16;
            operator_delete(ppVar12);
            ppVar12 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
            ppVar14 = ppVar12 + 0x1f;
            ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar27 != ppVar14[-1].first) goto LAB_001407a3;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar14[-1].second] = uVar16;
            ppVar14 = ppVar14 + -1;
          }
          ppVar9 = ppVar14;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar10) break;
        } while( true );
      }
      goto LAB_001407b4;
    }
  }
LAB_00140949:
  if (ppVar9 == ppVar10) {
LAB_00140ab8:
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_178,&local_f8);
    if (local_f8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_f8.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Elt_pointer)
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Elt_pointer)
        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_1d8);
    return;
  }
  puVar21 = (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00140972:
  puVar6 = (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pppVar23 = pppVar15;
  ppVar11 = ppVar14;
  ppVar12 = ppVar9;
  do {
    uVar32 = (long)ppVar12 - (long)ppVar11 >> 4;
    uVar25 = uVar32 - 1;
    uVar22 = (long)uVar25 >> 5;
    uVar19 = uVar22;
    if ((long)uVar32 < 1) {
LAB_001409aa:
      ppVar13 = pppVar23[uVar19] + uVar25 + uVar19 * -0x20;
    }
    else {
      if (0x20 < uVar32) {
        uVar19 = uVar25 >> 5;
        goto LAB_001409aa;
      }
      ppVar13 = ppVar12 + -1;
    }
    if (ppVar13 == ppVar10) goto LAB_00140a72;
    ppVar13 = ppVar9;
    if (ppVar9 == ppVar14) {
      ppVar13 = pppVar15[-1] + 0x20;
    }
    if ((long)uVar32 < 1) {
LAB_001409fe:
      pppVar33 = pppVar23 + uVar22;
      ppVar35 = *pppVar33;
      ppVar37 = ppVar35 + uVar25 + uVar22 * -0x20;
    }
    else {
      if (0x20 < uVar32) {
        uVar22 = uVar25 >> 5;
        goto LAB_001409fe;
      }
      ppVar37 = ppVar12 + -1;
      pppVar33 = pppVar23;
      ppVar35 = ppVar11;
    }
    if (ppVar37 == ppVar35) {
      ppVar37 = pppVar33[-1] + 0x20;
    }
    if (ppVar13[-1].first != ppVar37[-1].first) goto LAB_00140a72;
    if (ppVar12 == ppVar11) {
      ppVar11 = pppVar23[-1];
      pppVar23 = pppVar23 + -1;
      ppVar12 = ppVar11 + 0x20;
    }
    ppVar13 = ppVar9;
    if (ppVar9 == ppVar14) {
      ppVar13 = pppVar15[-1] + 0x20;
    }
    ppVar12 = ppVar12 + -1;
    ppVar37 = ppVar12;
    if (ppVar12 == ppVar11) {
      ppVar37 = pppVar23[-1] + 0x20;
    }
    puVar6[ppVar37[-1].second] = ppVar13[-1].second;
  } while( true );
LAB_001407a3:
  ppVar9 = ppVar14;
  if (ppVar14 == ppVar10) goto LAB_001407b4;
  goto LAB_00140657;
LAB_001407b4:
  pcVar8 = local_168;
  ppVar12 = local_188;
  if (ppVar14 != ppVar10) {
    ppVar13 = ppVar14;
    if (ppVar14 == local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar13 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&local_148->first +
         (long)&(local_f8.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar13[-1].first) {
      ppVar14 = ppVar9;
      if (((comm *)((long)&pcVar30->_vptr_comm + 1U) < local_168) &&
         (*(long *)((long)&local_148->first +
                   (long)&(local_f8.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first) ==
          *(long *)((long)&local_148->first +
                   (long)&local_f8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].first))) {
        ppVar18 = local_f8.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (long)((long)&pcVar30->_vptr_comm + (long)((long)local_188 + 2U));
        do {
          pcVar31 = pcVar30;
          ppVar11 = local_170;
          if (local_168 <= (comm *)((long)&pcVar31->_vptr_comm + 2U)) goto LAB_00140870;
          ppVar5 = ppVar18 + -1;
          pcVar30 = (comm *)((long)&pcVar31->_vptr_comm + 1);
          puVar7 = &ppVar18->first;
          ppVar18 = ppVar18 + 1;
        } while (ppVar5->first == *puVar7);
        ppVar11 = (_Elt_pointer)((long)local_188 + (long)&pcVar30->_vptr_comm);
LAB_00140870:
        pcVar30 = (comm *)((long)&pcVar31->_vptr_comm + 1);
      }
      while (ppVar9 = ppVar14, ppVar14 != ppVar10) {
        ppVar13 = ppVar14;
        if (ppVar14 == local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar13[-1].first !=
            local_f8.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)ppVar11].first) break;
        if (ppVar14 == local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
               (unsigned_long)((long)ppVar11 + local_160);
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar14 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar14[-1].second] =
               (unsigned_long)((long)ppVar11 + local_160);
          ppVar14 = ppVar14 + -1;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
        }
      }
    }
  }
  pcVar30 = (comm *)((long)&pcVar30->_vptr_comm + 1);
  if (pcVar8 <= pcVar30) goto LAB_00140949;
  goto LAB_00140618;
LAB_00140a72:
  if (ppVar9 == ppVar14) {
    ppVar9 = pppVar15[-1] + 0x20;
  }
  puVar21[ppVar9[-1].second] = local_108;
  if (ppVar12 == ppVar11) {
    ppVar11 = pppVar23[-1];
    pppVar23 = pppVar23 + -1;
    ppVar12 = ppVar11 + 0x20;
  }
  ppVar9 = ppVar12 + -1;
  pppVar15 = pppVar23;
  ppVar14 = ppVar11;
  if (ppVar9 == ppVar10) goto LAB_00140ab8;
  goto LAB_00140972;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}